

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void UpdateDecoder(VP8LDecoder *dec,int width,int height)

{
  uint32_t sampling_bits;
  uint32_t uVar1;
  undefined4 in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  int num_bits;
  VP8LMetadata *hdr;
  undefined4 local_20;
  
  sampling_bits = *(uint32_t *)(in_RDI + 0xc4);
  *(uint32_t *)(in_RDI + 0x84) = in_ESI;
  *(undefined4 *)(in_RDI + 0x88) = in_EDX;
  uVar1 = VP8LSubSampleSize(in_ESI,sampling_bits);
  *(uint32_t *)(in_RDI + 200) = uVar1;
  if (sampling_bits == 0) {
    local_20 = -1;
  }
  else {
    local_20 = (1 << ((byte)sampling_bits & 0x1f)) + -1;
  }
  *(int *)(in_RDI + 0xc0) = local_20;
  return;
}

Assistant:

static void UpdateDecoder(VP8LDecoder* const dec, int width, int height) {
  VP8LMetadata* const hdr = &dec->hdr_;
  const int num_bits = hdr->huffman_subsample_bits_;
  dec->width_ = width;
  dec->height_ = height;

  hdr->huffman_xsize_ = VP8LSubSampleSize(width, num_bits);
  hdr->huffman_mask_ = (num_bits == 0) ? ~0 : (1 << num_bits) - 1;
}